

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::dispose
          (ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *this)

{
  SocketAddress *firstElement;
  RemoveConst<kj::(anonymous_namespace)::SocketAddress> *pRVar1;
  SocketAddress *pSVar2;
  SocketAddress *endCopy;
  SocketAddress *posCopy;
  SocketAddress *ptrCopy;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pSVar2 = this->endPtr;
  if (firstElement != (SocketAddress *)0x0) {
    this->ptr = (SocketAddress *)0x0;
    this->pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    this->endPtr = (SocketAddress *)0x0;
    ArrayDisposer::dispose<kj::(anonymous_namespace)::SocketAddress>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x88,
               ((long)pSVar2 - (long)firstElement) / 0x88);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }